

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cdr.cpp
# Opt level: O2

Cdr * __thiscall eprosima::fastcdr::Cdr::serialize(Cdr *this,float float_t)

{
  bool bVar1;
  size_t sVar2;
  char *pcVar3;
  float *pfVar4;
  NotEnoughMemoryException *this_00;
  
  sVar2 = alignment(this,4);
  pcVar3 = (this->m_currentPosition).m_currentPosition;
  if ((ulong)((long)(this->m_lastPosition).m_currentPosition - (long)pcVar3) < sVar2 + 4) {
    bVar1 = resize(this,sVar2 + 4);
    if (!bVar1) {
      this_00 = (NotEnoughMemoryException *)__cxa_allocate_exception(0x28);
      exception::NotEnoughMemoryException::NotEnoughMemoryException
                (this_00,&exception::NotEnoughMemoryException::NOT_ENOUGH_MEMORY_MESSAGE_DEFAULT);
      __cxa_throw(this_00,&exception::NotEnoughMemoryException::typeinfo,
                  exception::NotEnoughMemoryException::~NotEnoughMemoryException);
    }
    pcVar3 = (this->m_currentPosition).m_currentPosition;
  }
  this->m_lastDataSize = 4;
  pfVar4 = (float *)(pcVar3 + sVar2);
  (this->m_currentPosition).m_currentPosition = (char *)pfVar4;
  if (this->m_swapBytes == true) {
    (this->m_currentPosition).m_currentPosition = (char *)((long)pfVar4 + 1);
    *(char *)pfVar4 = (char)((uint)float_t >> 0x18);
    pcVar3 = (this->m_currentPosition).m_currentPosition;
    (this->m_currentPosition).m_currentPosition = pcVar3 + 1;
    *pcVar3 = (char)((uint)float_t >> 0x10);
    pcVar3 = (this->m_currentPosition).m_currentPosition;
    (this->m_currentPosition).m_currentPosition = pcVar3 + 1;
    *pcVar3 = (char)((uint)float_t >> 8);
    pcVar3 = (this->m_currentPosition).m_currentPosition;
    (this->m_currentPosition).m_currentPosition = pcVar3 + 1;
    *pcVar3 = SUB41(float_t,0);
  }
  else {
    *pfVar4 = float_t;
    (this->m_currentPosition).m_currentPosition = (char *)(pfVar4 + 1);
  }
  return this;
}

Assistant:

Cdr& Cdr::serialize(const float float_t)
{
    size_t align = alignment(sizeof(float_t));
    size_t sizeAligned = sizeof(float_t) + align;

    if(((m_lastPosition - m_currentPosition) >= sizeAligned) || resize(sizeAligned))
    {
        // Save last datasize.
        m_lastDataSize = sizeof(float_t);

        // Align.
        makeAlign(align);

        if(m_swapBytes)
        {
            const char *dst = reinterpret_cast<const char*>(&float_t);

            m_currentPosition++ << dst[3];
            m_currentPosition++ << dst[2];
            m_currentPosition++ << dst[1];
            m_currentPosition++ << dst[0];
        }
        else
        {
            m_currentPosition << float_t;
            m_currentPosition += sizeof(float_t);
        }

        return *this;
    }

    throw NotEnoughMemoryException(NotEnoughMemoryException::NOT_ENOUGH_MEMORY_MESSAGE_DEFAULT);
}